

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

iterator divsufsortxx::helper::
         median3<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                   (substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td,iterator v1,
                   iterator v2,iterator v3)

{
  iterator iVar1;
  value_type vVar2;
  value_type vVar3;
  int iVar4;
  BitmapArray<long> *this;
  pos_type in_RCX;
  BitmapArray<long> *in_RDX;
  pos_type in_RSI;
  BitmapArray<long> *in_RDI;
  BitmapArray<long> *in_R8;
  pos_type in_R9;
  reference rVar5;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *in_stack_ffffffffffffff60;
  BitmapArray<long> *local_10;
  pos_type local_8;
  
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11bf6e);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11bf82);
  vVar2 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (in_stack_ffffffffffffff60,
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  iVar4 = (int)vVar2;
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11bfa3);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11bfb7);
  vVar2 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (in_stack_ffffffffffffff60,CONCAT44(iVar4,in_stack_ffffffffffffff58));
  if (vVar2 < iVar4) {
    std::swap<bitmap::BitmapArray<long>::iterator>
              ((iterator *)in_stack_ffffffffffffff60,
               (iterator *)CONCAT44(iVar4,in_stack_ffffffffffffff58));
  }
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11bff3);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11c007);
  vVar2 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (in_stack_ffffffffffffff60,CONCAT44(iVar4,in_stack_ffffffffffffff58));
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11c025);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11c039);
  vVar3 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (in_stack_ffffffffffffff60,CONCAT44(iVar4,in_stack_ffffffffffffff58));
  local_10 = in_RDX;
  local_8 = in_RCX;
  if (vVar3 < vVar2) {
    bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11c064);
    bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11c078);
    vVar2 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                      (in_stack_ffffffffffffff60,CONCAT44(iVar4,in_stack_ffffffffffffff58));
    rVar5 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11c095);
    this = rVar5.array_;
    bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11c0a9);
    vVar3 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                      ((substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *)this,
                       CONCAT44(iVar4,in_stack_ffffffffffffff58));
    local_10 = in_R8;
    local_8 = in_R9;
    if (vVar3 < vVar2) {
      local_10 = in_RDI;
      local_8 = in_RSI;
    }
  }
  iVar1.pos_ = local_8;
  iVar1.array_ = local_10;
  return iVar1;
}

Assistant:

SAIterator_type median3(const StringIterator_type Td, SAIterator_type v1,
                        SAIterator_type v2, SAIterator_type v3) {
  if (Td[*v1] > Td[*v2]) {
    std::swap(v1, v2);
  }
  if (Td[*v2] > Td[*v3]) {
    if (Td[*v1] > Td[*v3]) {
      return v1;
    } else {
      return v3;
    }
  }
  return v2;
}